

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

string * __thiscall
util::
make_string<char_const(&)[24],int,char_const(&)[5],int&,char_const(&)[6],CylHead&,char_const(&)[8]>
          (string *__return_storage_ptr__,util *this,char (*args) [24],int *args_1,
          char (*args_2) [5],int *args_3,char (*args_4) [6],CylHead *args_5,char (*args_6) [8])

{
  ostringstream local_1b0 [8];
  ostringstream ss;
  char (*args_local_4) [6];
  int *args_local_3;
  char (*args_local_2) [5];
  int *args_local_1;
  char (*args_local) [24];
  
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  std::operator<<((ostream *)local_1b0,(char *)this);
  std::ostream::operator<<(local_1b0,*(int *)*args);
  std::operator<<((ostream *)local_1b0,(char *)args_1);
  std::ostream::operator<<(local_1b0,*(int *)*args_2);
  std::operator<<((ostream *)local_1b0,(char *)args_3);
  ::operator<<((ostream *)local_1b0,(CylHead *)args_4);
  std::operator<<((ostream *)local_1b0,(char *)args_5);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}